

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
MapAllocator<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair>
::
construct<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair_const&>
          (MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
           *this,KeyValuePair *p,KeyValuePair *args)

{
  KeyValuePair *in_RDX;
  KeyValuePair *in_RSI;
  
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair::KeyValuePair
            (in_RSI,in_RDX);
  return;
}

Assistant:

void construct(NodeType* p, Args&&... args) {
      // Clang 3.6 doesn't compile static casting to void* directly. (Issue
      // #1266) According C++ standard 5.2.9/1: "The static_cast operator shall
      // not cast away constness". So first the maybe const pointer is casted to
      // const void* and after the const void* is const casted.
      new (const_cast<void*>(static_cast<const void*>(p)))
          NodeType(std::forward<Args>(args)...);
    }